

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O3

void Fl::remove_handler(Fl_Event_Handler ha)

{
  handler_link *phVar1;
  handler_link **pphVar2;
  handler_link *phVar3;
  
  if (handlers == (handler_link *)0x0) {
    return;
  }
  phVar3 = handlers;
  if (handlers->handle == ha) {
    phVar1 = (handler_link *)0x0;
  }
  else {
    do {
      phVar1 = phVar3;
      phVar3 = phVar1->next;
      if (phVar3 == (handler_link *)0x0) {
        return;
      }
    } while (phVar3->handle != ha);
  }
  pphVar2 = &handlers;
  if (phVar1 != (handler_link *)0x0) {
    pphVar2 = &phVar1->next;
  }
  *pphVar2 = phVar3->next;
  operator_delete(phVar3,0x10);
  return;
}

Assistant:

void Fl::remove_handler(Fl_Event_Handler ha) {
  handler_link *l, *p;

  // Search for the handler in the list...
  for (l = handlers, p = 0; l && l->handle != ha; p = l, l = l->next) {/*empty*/}

  if (l) {
    // Found it, so remove it from the list...
    if (p) p->next = l->next;
    else handlers = l->next;

    // And free the record...
    delete l;
  }
}